

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

bool negative_binomial_check(int a,double b)

{
  long lVar1;
  char *pcVar2;
  
  if (a < 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"NEGATIVE_BINOMIAL_CHECK - Warning!\n",0x23);
    pcVar2 = "  A < 0.\n";
    lVar1 = 9;
  }
  else {
    if ((0.0 < b) && (b <= 1.0)) {
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," \n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"NEGATIVE_BINOMIAL_CHECK - Warning!\n",0x23);
    pcVar2 = "  B <= 0 or 1 < B.\n";
    lVar1 = 0x13;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  return false;
}

Assistant:

bool negative_binomial_check ( int a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    NEGATIVE_BINOMIAL_CHECK checks parameters of the Negative Binomial PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int A, double B, parameters of the PDF.
//    0 <= A,
//    0 < B <= 1.
//
//    Output, bool NEGATIVE_BINOMIAL_CHECK, is true if the
//    parameters are legal.
//
{
  if ( a < 0 )
  {
    cout << " \n";
    cout << "NEGATIVE_BINOMIAL_CHECK - Warning!\n";
    cout << "  A < 0.\n";
    return false;
  }

  if ( b <= 0.0 || 1.0 < b )
  {
    cout << " \n";
    cout << "NEGATIVE_BINOMIAL_CHECK - Warning!\n";
    cout << "  B <= 0 or 1 < B.\n";
    return false;
  }

  return true;
}